

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

AcoshLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_acosh(NeuralNetworkLayer *this)

{
  AcoshLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x307) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x307;
    this_00 = (AcoshLayerParams *)operator_new(0x18);
    AcoshLayerParams::AcoshLayerParams(this_00);
    (this->layer_).acosh_ = this_00;
  }
  return (AcoshLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AcoshLayerParams* NeuralNetworkLayer::mutable_acosh() {
  if (!has_acosh()) {
    clear_layer();
    set_has_acosh();
    layer_.acosh_ = new ::CoreML::Specification::AcoshLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.acosh)
  return layer_.acosh_;
}